

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O1

_Bool hdr_record_values(hdr_histogram *h,int64_t value,int64_t count)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  if ((-1 < value) && (value <= h->highest_trackable_value)) {
    uVar3 = h->sub_bucket_mask | value;
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    iVar5 = ((uint)lVar2 ^ 0x3f) + h->sub_bucket_half_count_magnitude + h->unit_magnitude;
    iVar5 = ((0x40 - iVar5 << ((byte)h->sub_bucket_half_count_magnitude & 0x1f)) -
            h->sub_bucket_half_count) +
            (int)((ulong)value >> (((char)h->unit_magnitude - (char)iVar5) + 0x3fU & 0x3f));
    if ((-1 < iVar5) && (iVar1 = h->counts_len, iVar5 < iVar1)) {
      if (h->normalizing_index_offset != 0) {
        iVar5 = iVar5 - h->normalizing_index_offset;
        iVar6 = 0;
        if (iVar1 <= iVar5) {
          iVar6 = -iVar1;
        }
        if (iVar5 < 0) {
          iVar6 = iVar1;
        }
        iVar5 = iVar5 + iVar6;
      }
      h->counts[iVar5] = h->counts[iVar5] + count;
      h->total_count = h->total_count + count;
      lVar2 = h->min_value;
      lVar4 = value;
      if (lVar2 < value) {
        lVar4 = lVar2;
      }
      if (value == 0) {
        lVar4 = lVar2;
      }
      h->min_value = lVar4;
      if (value < h->max_value) {
        value = h->max_value;
      }
      h->max_value = value;
      return true;
    }
  }
  return false;
}

Assistant:

bool hdr_record_values(struct hdr_histogram* h, int64_t value, int64_t count)
{
    int32_t counts_index;

    if (value < 0 || h->highest_trackable_value < value)
    {
        return false;
    }

    counts_index = counts_index_for(h, value);
    if (counts_index < 0 || h->counts_len <= counts_index)
    {
        return false;
    }

    counts_inc_normalised(h, counts_index, count);
    update_min_max(h, value);

    return true;
}